

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Sequence.cpp
# Opt level: O2

double __thiscall chrono::ChFunction_Sequence::Get_y_dxdx(ChFunction_Sequence *this,double x)

{
  _List_node_base *p_Var1;
  double dVar2;
  
  dVar2 = 0.0;
  p_Var1 = (_List_node_base *)&this->functions;
  while (p_Var1 = (((_List_base<chrono::ChFseqNode,_std::allocator<chrono::ChFseqNode>_> *)
                   &p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&this->functions) {
    if ((double)p_Var1[3]._M_next <= x) {
      if (x < (double)p_Var1[3]._M_prev) {
        dVar2 = (double)(**(code **)(*(long *)p_Var1[1]._M_next + 0x30))
                                  (x - (double)p_Var1[3]._M_next);
        dVar2 = dVar2 + (double)p_Var1[5]._M_next;
      }
    }
  }
  return dVar2;
}

Assistant:

double ChFunction_Sequence::Get_y_dxdx(double x) const {
    double res = 0;
    double localtime;
    for (auto iter = functions.begin(); iter != functions.end(); ++iter) {
        if ((x >= iter->t_start) && (x < iter->t_end)) {
            localtime = x - iter->t_start;
            res = iter->fx->Get_y_dxdx(localtime) + iter->Iydtdt;
        }
    }
    return res;
}